

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O1

bool __thiscall CBinds::CBindsSpecial::OnInput(CBindsSpecial *this,CEvent Event)

{
  CBinds *pCVar1;
  IConsole *pIVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  
  uVar3 = GetModifierMask(((this->super_CComponent).m_pClient)->m_pInput);
  if (Event.m_Key - 0xbaU < 0xc || Event.m_Key - 0xe8U < 0xc) {
    uVar6 = (ulong)(uint)Event.m_Key << 9 | 0x28;
    lVar4 = 0;
    bVar5 = false;
    do {
      if (((uVar3 >> ((uint)lVar4 & 0x1f) & 1) != 0) &&
         (pCVar1 = this->m_pBinds,
         *(char *)((long)(pCVar1->m_aaaKeyBindings + -1) + 0x1d8 + uVar6) != '\0')) {
        if (((undefined1  [144])Event & (undefined1  [144])0x1) != (undefined1  [144])0x0) {
          pIVar2 = ((pCVar1->super_CComponent).m_pClient)->m_pConsole;
          (*(pIVar2->super_IInterface)._vptr_IInterface[0x15])
                    (pIVar2,1,(long)(pCVar1->m_aaaKeyBindings + -1) + 0x1d8 + uVar6);
        }
        bVar5 = true;
        if (((undefined1  [144])Event & (undefined1  [144])0x2) != (undefined1  [144])0x0) {
          pIVar2 = ((this->m_pBinds->super_CComponent).m_pClient)->m_pConsole;
          (*(pIVar2->super_IInterface)._vptr_IInterface[0x15])
                    (pIVar2,0,(long)(this->m_pBinds->m_aaaKeyBindings + -1) + 0x1d8 + uVar6);
        }
      }
      lVar4 = lVar4 + 1;
      uVar6 = uVar6 + 0x80;
    } while (lVar4 != 4);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool CBinds::CBindsSpecial::OnInput(IInput::CEvent Event)
{
	int Mask = GetModifierMask(Input());

	// don't handle anything but FX and composed FX binds
	if(/*Mask == 1 && */!(Event.m_Key >= KEY_F1 && Event.m_Key <= KEY_F12) && !(Event.m_Key >= KEY_F13 && Event.m_Key <= KEY_F24))
		return false;

	bool rtn = false;
	for(int m = 0; m < MODIFIER_COUNT; m++)
	{
		if((Mask&(1 << m)) && m_pBinds->m_aaaKeyBindings[Event.m_Key][m][0] != 0)
		{
			if(Event.m_Flags&IInput::FLAG_PRESS)
				m_pBinds->GetConsole()->ExecuteLineStroked(1, m_pBinds->m_aaaKeyBindings[Event.m_Key][m]);
			if(Event.m_Flags&IInput::FLAG_RELEASE)
				m_pBinds->GetConsole()->ExecuteLineStroked(0, m_pBinds->m_aaaKeyBindings[Event.m_Key][m]);
			rtn = true;
		}
	}
	return rtn;
}